

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::AssignExpr::AssignExpr
          (AssignExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *target,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *value,Token *oper)

{
  Token *oper_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *value_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *target_local;
  AssignExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__AssignExpr_0016a4e0;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->target,target);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->value,value);
  Token::Token(&this->oper,oper);
  return;
}

Assistant:

AssignExpr(std::unique_ptr<Expr> target, std::unique_ptr<Expr> value, Token oper) :
                target{std::move(target)},
                value{std::move(value)},
                oper{std::move(oper)} {}